

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkSetMaxEFailGrowth(void *arkode_mem,realtype etamxf)

{
  int iVar1;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = etamxf;
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetMaxEFailGrowth",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->etamxf =
         (realtype)
         (-(ulong)(local_18 <= 0.0) & 0x3fd3333333333333 |
         ~-(ulong)(local_18 <= 0.0) &
         (~-(ulong)(1.0 < local_18) & (ulong)local_18 |
         -(ulong)(1.0 < local_18) & 0x3fd3333333333333));
  }
  return iVar1;
}

Assistant:

int arkSetMaxEFailGrowth(void *arkode_mem, realtype etamxf)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetMaxEFailGrowth",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if ((etamxf <= ZERO) || (etamxf > ONE)) {
    hadapt_mem->etamxf = ETAMXF;
  } else {
    hadapt_mem->etamxf = etamxf;
  }

  return(ARK_SUCCESS);
}